

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

BOOL __thiscall Js::ScriptContext::CheckObject(ScriptContext *this,Var object)

{
  Type ppvVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = (ulong)(this->operationStack->list).
                 super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>.count;
  if ((long)uVar4 < 1) {
    uVar3 = 0;
  }
  else {
    ppvVar1 = (this->operationStack->list).
              super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>.buffer;
    if (*ppvVar1 == object) {
      uVar3 = 1;
    }
    else {
      uVar5 = 0;
      do {
        uVar6 = uVar4;
        if (uVar4 - 1 == uVar5) break;
        uVar6 = uVar5 + 1;
        lVar2 = uVar5 + 1;
        uVar5 = uVar6;
      } while (ppvVar1[lVar2] != object);
      uVar3 = (uint)(uVar6 < uVar4);
    }
  }
  return uVar3;
}

Assistant:

BOOL ScriptContext::CheckObject(Var object)
    {
        return operationStack->Contains(object);
    }